

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::intersect_metrics_dim<2>(Omega_h *this,Reals *a,Reals *b)

{
  Alloc *pAVar1;
  int n;
  ulong uVar2;
  ulong uVar3;
  void *extraout_RDX;
  size_t sVar4;
  Reals RVar5;
  allocator local_71;
  Write<double> c;
  Write<signed_char> local_60;
  type f;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  n = divide_no_remainder<int>((int)(sVar4 >> 3),3);
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  pAVar1 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  if ((int)(uVar2 >> 3) == (int)(uVar3 >> 3)) {
    std::__cxx11::string::string((string *)&f,"",&local_71);
    Write<double>::Write(&c,n * 3,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Write<double>::Write((Write<double> *)&f,&a->write_);
    Write<double>::Write(&f.b.write_,&b->write_);
    Write<double>::Write(&f.c,&c);
    parallel_for<Omega_h::intersect_metrics_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              (n,&f,"intersect_metrics");
    Write<double>::Write(&local_60,(Write<signed_char> *)&c);
    Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_60);
    Write<double>::~Write((Write<double> *)&local_60);
    intersect_metrics_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)&f);
    Write<double>::~Write(&c);
    RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar5.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
       ,0x21a);
}

Assistant:

Reals intersect_metrics_dim(Reals a, Reals b) {
  auto n = divide_no_remainder(a.size(), symm_ncomps(dim));
  OMEGA_H_CHECK(a.size() == b.size());
  auto c = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto am = get_symm<dim>(a, i);
    auto bm = get_symm<dim>(b, i);
    auto cm = intersect_metrics(am, bm);
    set_symm(c, i, cm);
  };
  parallel_for(n, f, "intersect_metrics");
  return c;
}